

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O0

int __thiscall
TPZBlockDiagonal<long_double>::Substitution
          (TPZBlockDiagonal<long_double> *this,TPZFMatrix<long_double> *B)

{
  long lVar1;
  int64_t iVar2;
  int64_t iVar3;
  long *plVar4;
  int *piVar5;
  longdouble *plVar6;
  TPZBaseMatrix *in_RSI;
  long in_RDI;
  longdouble *ptr;
  TPZFMatrix<long_double> BTemp;
  int64_t nc;
  int64_t c;
  int64_t eq;
  int64_t bsize;
  int64_t pos;
  int64_t nb;
  int64_t b;
  int64_t in_stack_ffffffffffffff10;
  int64_t in_stack_ffffffffffffff18;
  TPZFMatrix<long_double> *in_stack_ffffffffffffff20;
  int64_t in_stack_ffffffffffffff40;
  longdouble *in_stack_ffffffffffffff48;
  int64_t in_stack_ffffffffffffff50;
  int64_t in_stack_ffffffffffffff58;
  TPZFMatrix<long_double> *in_stack_ffffffffffffff60;
  int64_t in_stack_ffffffffffffff68;
  longdouble *in_stack_ffffffffffffff70;
  long local_40;
  int64_t local_18;
  
  if (*(char *)(in_RDI + 0x18) != '\x01') {
    TPZMatrix<long_double>::Error((char *)this,(char *)B);
  }
  iVar2 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x60));
  iVar3 = TPZBaseMatrix::Cols(in_RSI);
  for (local_40 = 0; local_40 < iVar3; local_40 = local_40 + 1) {
    for (local_18 = 0; local_18 < iVar2; local_18 = local_18 + 1) {
      plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_18);
      lVar1 = *plVar4;
      piVar5 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x60),local_18);
      if (*piVar5 != 0) {
        TPZFMatrix<long_double>::operator()
                  (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
        TPZFMatrix<long_double>::TPZFMatrix
                  (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                   in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
        plVar6 = TPZVec<long_double>::begin((TPZVec<long_double> *)(in_RDI + 0x20));
        in_stack_ffffffffffffff20 = (TPZFMatrix<long_double> *)(plVar6 + lVar1);
        TPZFMatrix<long_double>::Substitution
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x11f0809);
      }
    }
  }
  return 1;
}

Assistant:

int
TPZBlockDiagonal<TVar>::Substitution( TPZFMatrix<TVar> *B) const
{
	if(this->fDecomposed != ELU) {
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZBlockDiagonal::Decompose_LU is decomposed with other scheme");
	}
	
	int64_t b,nb,pos,bsize,eq=0;
	nb = fBlockSize.NElements();
	int64_t c, nc = B->Cols();
	for(c=0; c<nc; c++) {
		eq = 0;
		for(b=0;b<nb; b++) {
			pos = fBlockPos[b];
			bsize = fBlockSize[b];
			if(!bsize) continue;
			TPZFMatrix<TVar> BTemp(bsize,1,&(B->operator()(eq,c)),bsize);
			TVar *ptr = fStorage.begin()+pos;
			TPZFMatrix<TVar>::Substitution(ptr,bsize,&BTemp);
			eq+= bsize;
		}
	}
	return 1;
}